

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O0

int arg_match_helper(arg *arg_,arg_def *def,char **argv,char *err_msg)

{
  int iVar1;
  size_t __n;
  char *in_RCX;
  char **in_RDX;
  long *in_RSI;
  void *in_RDI;
  size_t name_len;
  arg arg;
  long local_90;
  long local_88;
  arg local_78;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 local_38;
  long *local_30;
  char *local_28;
  long *local_18;
  void *local_10;
  int local_4;
  
  if (in_RCX != (char *)0x0) {
    *in_RCX = '\0';
  }
  if ((*in_RDX == (char *)0x0) || (**in_RDX != '-')) {
    local_4 = 0;
  }
  else {
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    arg_init(&local_78,in_RDX);
    memcpy(&local_50,&local_78,0x28);
    if ((*local_18 == 0) || (iVar1 = strcmp((char *)(*local_50 + 1),(char *)*local_18), iVar1 != 0))
    {
      if (((local_18[1] != 0) &&
          ((__n = strlen((char *)local_18[1]), *(char *)(*local_50 + 1) == '-' &&
           (iVar1 = strncmp((char *)(*local_50 + 2),(char *)local_18[1],__n), iVar1 == 0)))) &&
         ((*(char *)(*local_50 + 2 + __n) == '=' || (*(char *)(*local_50 + 2 + __n) == '\0')))) {
        local_48 = *local_50 + 2;
        if (*(char *)(local_48 + __n) == '=') {
          local_90 = local_48 + __n + 1;
        }
        else {
          local_90 = 0;
        }
        local_40 = local_90;
        local_38 = 1;
      }
    }
    else {
      local_48 = *local_50 + 1;
      if ((int)local_18[2] == 0) {
        local_88 = 0;
      }
      else {
        local_88 = local_50[1];
      }
      local_40 = local_88;
      local_38 = 1;
      if ((int)local_18[2] != 0) {
        local_38 = 2;
      }
    }
    if (local_48 == 0) {
      local_4 = 0;
    }
    else if ((int)local_18[2] == -1) {
      local_30 = local_18;
      memcpy(local_10,&local_50,0x28);
      local_4 = 1;
    }
    else if ((local_40 == 0) && ((int)local_18[2] != 0)) {
      if (local_28 != (char *)0x0) {
        snprintf(local_28,200,"Error: option %s requires argument.\n",local_48);
      }
      local_4 = 0;
    }
    else if ((local_40 == 0) || ((int)local_18[2] != 0)) {
      local_30 = local_18;
      memcpy(local_10,&local_50,0x28);
      local_4 = 1;
    }
    else {
      if (local_28 != (char *)0x0) {
        snprintf(local_28,200,"Error: option %s requires no argument.\n",local_48);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arg_match_helper(struct arg *arg_, const struct arg_def *def, char **argv,
                     char *err_msg) {
  struct arg arg;

  if (err_msg) err_msg[0] = '\0';

  assert(def->has_val == 0 || def->has_val == 1 || def->has_val == -1);

  if (!argv[0] || argv[0][0] != '-') return 0;

  arg = arg_init(argv);

  if (def->short_name && !strcmp(arg.argv[0] + 1, def->short_name)) {
    arg.name = arg.argv[0] + 1;
    arg.val = def->has_val ? arg.argv[1] : NULL;
    arg.argv_step = def->has_val ? 2 : 1;
  } else if (def->long_name) {
    const size_t name_len = strlen(def->long_name);

    if (arg.argv[0][1] == '-' &&
        !strncmp(arg.argv[0] + 2, def->long_name, name_len) &&
        (arg.argv[0][name_len + 2] == '=' ||
         arg.argv[0][name_len + 2] == '\0')) {
      arg.name = arg.argv[0] + 2;
      arg.val = arg.name[name_len] == '=' ? arg.name + name_len + 1 : NULL;
      arg.argv_step = 1;
    }
  }

  if (arg.name) {
    if (def->has_val == -1) {
      arg.def = def;
      *arg_ = arg;
      return 1;
    }

    if (!arg.val && def->has_val) {
      SET_ERR_STRING("Error: option %s requires argument.\n", arg.name);
      return 0;
    }

    if (arg.val && !def->has_val) {
      SET_ERR_STRING("Error: option %s requires no argument.\n", arg.name);
      return 0;
    }

    arg.def = def;
    *arg_ = arg;
    return 1;
  }

  return 0;
}